

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseEncoder.cpp
# Opt level: O3

void __thiscall siamese::EncoderPacketWindow::ClearWindow(EncoderPacketWindow *this)

{
  EncoderColumnLane *pEVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long lVar4;
  undefined4 in_ECX;
  uint *puVar5;
  undefined1 auVar6 [16];
  
  auVar3 = vpmovsxbd_avx(ZEXT416(0x30201000));
  this->Count = 0;
  lVar4 = 0;
  this->LongestPacket = 0;
  this->FirstUnremovedElement = 0;
  this->SumStartElement = 0;
  this->SumEndElement = 0;
  puVar5 = &this->Lanes[0].LongestPacket;
  do {
    auVar6 = vpbroadcastd_avx512vl();
    lVar4 = lVar4 + 1;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = puVar5;
    vpscatterdd_avx512vl
              (auVar2 + ZEXT816(0xffffffffffffffd8) + auVar3,
               (ulong)CONCAT31((int3)((uint)in_ECX >> 8),7),(undefined1  [16])0x0);
    pEVar1 = (EncoderColumnLane *)(puVar5 + -0x10);
    auVar2 = vmovdqu32_avx512vl(auVar6);
    pEVar1->NextElement[0] = auVar2._0_4_;
    pEVar1->NextElement[1] = auVar2._4_4_;
    pEVar1->NextElement[2] = auVar2._8_4_;
    *(int *)&pEVar1->field_0xc = auVar2._12_4_;
    *puVar5 = 0;
    puVar5 = puVar5 + 0x12;
  } while (lVar4 != 8);
  return;
}

Assistant:

void EncoderPacketWindow::ClearWindow()
{
    FirstUnremovedElement = 0;
    Count                 = 0;
    LongestPacket         = 0;
    SumStartElement       = 0;
    SumEndElement         = 0;

    for (unsigned laneIndex = 0; laneIndex < kColumnLaneCount; ++laneIndex)
    {
        EncoderColumnLane& lane = Lanes[laneIndex];

        for (unsigned sumIndex = 0; sumIndex < kColumnSumCount; ++sumIndex)
        {
            lane.Sum[sumIndex].Bytes   = 0;
            lane.NextElement[sumIndex] = laneIndex;
        }
        lane.LongestPacket = 0;
    }
}